

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O2

void __thiscall args::Group::Reset(Group *this)

{
  pointer ppBVar1;
  Base **child;
  pointer ppBVar2;
  
  (this->super_Base).matched = false;
  ppBVar1 = (this->children).super__Vector_base<args::Base_*,_std::allocator<args::Base_*>_>._M_impl
            .super__Vector_impl_data._M_finish;
  for (ppBVar2 = (this->children).super__Vector_base<args::Base_*,_std::allocator<args::Base_*>_>.
                 _M_impl.super__Vector_impl_data._M_start; ppBVar2 != ppBVar1; ppBVar2 = ppBVar2 + 1
      ) {
    (*(*ppBVar2)->_vptr_Base[0xe])();
  }
  return;
}

Assistant:

virtual void Reset() noexcept
            {
                matched = false;
#ifdef ARGS_NOEXCEPT
                error = Error::None;
                errorMsg.clear();
#endif
            }